

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::LocalPipeline::~LocalPipeline(LocalPipeline *this)

{
  LocalPipeline *this_local;
  
  kj::Own<capnp::CallContextHook,_std::nullptr_t>::~Own(&this->context);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

inline LocalPipeline(kj::Own<CallContextHook>&& contextParam)
      : context(kj::mv(contextParam)),
        results(context->getResults(MessageSize { 0, 0 })) {}